

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsXmlParser.cpp
# Opt level: O0

void KDReports::XmlParser::parseCommonTableAttributes
               (AbstractTableElement *tableElement,QDomElement *element)

{
  qsizetype *this;
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  qreal border;
  QLatin1Char local_1d3;
  QChar local_1d2;
  QString local_1d0;
  QArrayDataPointer<char16_t> local_1b8;
  QString local_1a0;
  undefined1 local_188 [8];
  QString widthStr;
  QString local_158;
  QString local_140;
  QArrayDataPointer<char16_t> local_128;
  QString local_110;
  QString local_f8;
  QArrayDataPointer<char16_t> local_e0;
  QString local_c8;
  QBrush local_a0 [8];
  QColor local_98;
  undefined1 local_88 [8];
  QColor bgColor;
  QDomElement *element_local;
  AbstractTableElement *tableElement_local;
  char16_t *str_1;
  char16_t *str;
  char16_t *str_3;
  char16_t *str_2;
  
  bgColor._8_8_ = element;
  local_98 = XmlHelper::readBackground(element);
  local_88 = (undefined1  [8])local_98._0_8_;
  bgColor.cspec = local_98.ct._4_4_;
  bgColor.ct.argb.alpha = local_98.ct._8_2_;
  bVar2 = QColor::isValid((QColor *)local_88);
  if (bVar2) {
    QBrush::QBrush(local_a0,(QColor *)local_88,SolidPattern);
    Element::setBackground(&tableElement->super_Element,local_a0);
    QBrush::~QBrush(local_a0);
  }
  uVar1 = bgColor._8_8_;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_e0,(Data *)0x0,L"border",6);
  QString::QString(&local_c8,&local_e0);
  bVar3 = QDomElement::hasAttribute((QString *)uVar1);
  QString::~QString(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  uVar1 = bgColor._8_8_;
  if ((bVar3 & 1) != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_128,(Data *)0x0,L"border",6);
    QString::QString(&local_110,&local_128);
    QString::QString(&local_140);
    QDomElement::attribute((QString *)&local_f8,(QString *)uVar1);
    border = (qreal)QString::toDouble((bool *)&local_f8);
    AbstractTableElement::setBorder(tableElement,border);
    QString::~QString(&local_f8);
    QString::~QString(&local_140);
    QString::~QString(&local_110);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  }
  uVar1 = bgColor._8_8_;
  this = &widthStr.d.size;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)this,(Data *)0x0,L"width",5);
  QString::QString(&local_158,(DataPointer *)this);
  bVar3 = QDomElement::hasAttribute((QString *)uVar1);
  QString::~QString(&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&widthStr.d.size);
  uVar1 = bgColor._8_8_;
  if ((bVar3 & 1) != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1b8,(Data *)0x0,L"width",5);
    QString::QString(&local_1a0,&local_1b8);
    QString::QString(&local_1d0);
    QDomElement::attribute((QString *)local_188,(QString *)uVar1);
    QString::~QString(&local_1d0);
    QString::~QString(&local_1a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
    QLatin1Char::QLatin1Char(&local_1d3,'%');
    QChar::QChar(&local_1d2,local_1d3);
    bVar3 = QString::endsWith((QChar *)local_188,(uint)(ushort)local_1d2.ucs);
    if ((bVar3 & 1) == 0) {
      iVar4 = QString::toInt((QString *)local_188,(bool *)0x0,10);
      AbstractTableElement::setWidth(tableElement,(double)iVar4,Millimeters);
    }
    else {
      QString::length((QString *)local_188);
      QString::truncate((longlong)local_188);
      iVar4 = QString::toInt((QString *)local_188,(bool *)0x0,10);
      AbstractTableElement::setWidth(tableElement,(double)iVar4,Percent);
    }
    QString::~QString((QString *)local_188);
  }
  return;
}

Assistant:

void KDReports::XmlParser::parseCommonTableAttributes(KDReports::AbstractTableElement &tableElement, QDomElement &element)
{
    const QColor bgColor = KDReports::XmlHelper::readBackground(element);
    if (bgColor.isValid())
        tableElement.setBackground(bgColor);
    if (element.hasAttribute(QStringLiteral("border")))
        tableElement.setBorder(element.attribute(QStringLiteral("border")).toDouble());
    if (element.hasAttribute(QStringLiteral("width"))) {
        QString widthStr = element.attribute(QStringLiteral("width"));
        if (widthStr.endsWith(QLatin1Char('%'))) {
            widthStr.truncate(widthStr.length() - 1);
            tableElement.setWidth(widthStr.toInt(), KDReports::Percent);
        } else {
            tableElement.setWidth(widthStr.toInt());
        }
    }
}